

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDAttDefList.cpp
# Opt level: O2

XMLAttDef * __thiscall
xercesc_4_0::DTDAttDefList::findAttDef(DTDAttDefList *this,uint param_1,XMLCh *attName)

{
  DTDAttDef *pDVar1;
  
  pDVar1 = RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::get
                     (this->fList,attName);
  return &pDVar1->super_XMLAttDef;
}

Assistant:

XMLAttDef* DTDAttDefList::findAttDef(const  unsigned int
                                    , const XMLCh* const    attName)
{
    // We don't use the URI, so we just look up the name
    return fList->get(attName);
}